

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitsOffset(ReflectionSchema *this)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.h"
               ,0xa6);
    other = LogMessage::operator<<(&local_50,"CHECK failed: HasHasbits(): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  return this->has_bits_offset_;
}

Assistant:

uint32 HasBitsOffset() const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bits_offset_;
  }